

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O0

MPP_RET jpegd_prepare(void *ctx,MppPacket pkt,HalDecTask *task)

{
  uint src_size;
  RK_U8 *src;
  size_t sVar1;
  RK_S64 RVar2;
  void *pvVar3;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  uint local_64;
  RK_U32 eos;
  RK_U32 pkt_length;
  RK_U8 *pos;
  void *base;
  MppPacket pvStack_40;
  RK_U32 copy_length;
  MppPacket input_packet;
  JpegdCtx *JpegCtx;
  HalDecTask *pHStack_28;
  MPP_RET ret;
  HalDecTask *task_local;
  MppPacket pkt_local;
  void *ctx_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  pHStack_28 = task;
  task_local = (HalDecTask *)pkt;
  pkt_local = ctx;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_prepare");
  }
  JpegCtx._4_4_ = MPP_OK;
  input_packet = pkt_local;
  if (*(int *)((long)pkt_local + 0x48) == 0) {
    *(HalDecTask **)((long)pkt_local + 0x28) = task_local;
  }
  pvStack_40 = *(MppPacket *)((long)pkt_local + 0x28);
  base._4_4_ = 0;
  src = (RK_U8 *)mpp_packet_get_pos(task_local);
  sVar1 = mpp_packet_get_length(task_local);
  src_size = (uint)sVar1;
  if (src_size == 0) {
    local_64 = 1;
  }
  else {
    local_64 = mpp_packet_get_eos(task_local);
  }
  RVar2 = mpp_packet_get_pts(task_local);
  *(RK_S64 *)((long)input_packet + 0x38) = RVar2;
  pHStack_28->valid = 0;
  (pHStack_28->flags).val = (pHStack_28->flags).val & 0xfffffffffffffffe | (ulong)local_64 & 1;
  *(uint *)((long)input_packet + 0x40) = local_64;
  if ((jpegd_debug & 0x20) != 0) {
    _mpp_log_l(4,"jpegd_parser","pkt_length %d eos %d\n",(char *)0x0,sVar1 & 0xffffffff,
               (ulong)local_64);
  }
  if (src_size == 0) {
    if ((jpegd_debug & 0x20) != 0) {
      _mpp_log_l(4,"jpegd_parser","it is end of stream.",(char *)0x0);
    }
    ctx_local._4_4_ = JpegCtx._4_4_;
  }
  else {
    if (*(uint *)((long)input_packet + 0x24) < src_size) {
      if ((jpegd_debug & 0x20) != 0) {
        _mpp_log_l(4,"jpegd_parser","Huge Frame(%d Bytes)! bufferSize:%d",(char *)0x0,
                   sVar1 & 0xffffffff,(ulong)*(uint *)((long)input_packet + 0x24));
      }
      mpp_osal_free("jpegd_prepare",*(void **)((long)input_packet + 0x18));
      *(undefined8 *)((long)input_packet + 0x18) = 0;
      pvVar3 = mpp_osal_calloc("jpegd_prepare",(ulong)(src_size + 0x400));
      *(void **)((long)input_packet + 0x18) = pvVar3;
      if (*(long *)((long)input_packet + 0x18) == 0) {
        _mpp_log_l(2,"jpegd_parser","no memory!","jpegd_prepare");
        return MPP_ERR_NOMEM;
      }
      *(uint *)((long)input_packet + 0x24) = src_size + 0x400;
    }
    if (*(int *)((long)input_packet + 0x48) != 0) {
      jpegd_split_frame(src,src_size,*(RK_U8 **)((long)input_packet + 0x18),
                        *(RK_U32 *)((long)input_packet + 0x24),(RK_U32 *)((long)&base + 4));
    }
    mpp_packet_set_pos(task_local,src + (sVar1 & 0xffffffff));
    if ((base._4_4_ != src_size) && ((jpegd_debug & 0x20) != 0)) {
      _mpp_log_l(4,"jpegd_parser","packet prepare, pkt_length:%d, copy_length:%d\n",(char *)0x0,
                 sVar1 & 0xffffffff,(ulong)base._4_4_);
    }
    if ((jpegd_debug & 0x10) != 0) {
      snprintf(jpegd_prepare::name,0x1f,"/data/input%02d.jpg",
               (ulong)*(uint *)((long)input_packet + 0x44));
      jpegd_prepare::jpg_file = (FILE *)fopen(jpegd_prepare::name,"wb+");
      if ((FILE *)jpegd_prepare::jpg_file != (FILE *)0x0) {
        if ((jpegd_debug & 0x10) != 0) {
          uVar4 = 0;
          _mpp_log_l(4,"jpegd_parser","frame_%02d input jpeg(%d Bytes) saving to %s\n",(char *)0x0,
                     (ulong)*(uint *)((long)input_packet + 0x44),sVar1 & 0xffffffff,
                     jpegd_prepare::name);
        }
        fwrite(src,sVar1 & 0xffffffff,1,(FILE *)jpegd_prepare::jpg_file);
        fclose((FILE *)jpegd_prepare::jpg_file);
        *(int *)((long)input_packet + 0x44) = *(int *)((long)input_packet + 0x44) + 1;
      }
    }
    if (*(int *)((long)input_packet + 0x48) != 0) {
      mpp_packet_set_data(pvStack_40,*(void **)((long)input_packet + 0x18));
      mpp_packet_set_size(pvStack_40,sVar1 & 0xffffffff);
      mpp_packet_set_length(pvStack_40,sVar1 & 0xffffffff);
      memcpy(src,*(void **)((long)input_packet + 0x18),sVar1 & 0xffffffff);
    }
    *(uint *)((long)input_packet + 0x20) = src_size;
    pHStack_28->input_packet = pvStack_40;
    pHStack_28->valid = 1;
    if ((jpegd_debug & 0x20) != 0) {
      _mpp_log_l(4,"jpegd_parser","input_packet:%p, recv_buffer:%p, pkt_length:%d",(char *)0x0,
                 pvStack_40,*(undefined8 *)((long)input_packet + 0x18),CONCAT44(uVar4,src_size));
    }
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_prepare");
    }
    ctx_local._4_4_ = JpegCtx._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET jpegd_prepare(void *ctx, MppPacket pkt, HalDecTask *task)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    if (!JpegCtx->copy_flag) {
        /* no need to copy stream, handle packet from upper application directly*/
        JpegCtx->input_packet = pkt;
    }

    MppPacket input_packet = JpegCtx->input_packet;
    RK_U32 copy_length = 0;
    void *base = mpp_packet_get_pos(pkt);
    RK_U8 *pos = base;
    RK_U32 pkt_length = (RK_U32)mpp_packet_get_length(pkt);
    RK_U32 eos = (pkt_length) ? (mpp_packet_get_eos(pkt)) : (1);

    JpegCtx->pts = mpp_packet_get_pts(pkt);

    task->valid = 0;
    task->flags.eos = eos;
    JpegCtx->eos = eos;

    jpegd_dbg_parser("pkt_length %d eos %d\n", pkt_length, eos);

    if (!pkt_length) {
        jpegd_dbg_parser("it is end of stream.");
        return ret;
    }

    if (pkt_length > JpegCtx->bufferSize) {
        jpegd_dbg_parser("Huge Frame(%d Bytes)! bufferSize:%d",
                         pkt_length, JpegCtx->bufferSize);
        mpp_free(JpegCtx->recv_buffer);
        JpegCtx->recv_buffer = NULL;

        JpegCtx->recv_buffer = mpp_calloc(RK_U8, pkt_length + 1024);
        if (NULL == JpegCtx->recv_buffer) {
            mpp_err_f("no memory!");
            return MPP_ERR_NOMEM;
        }

        JpegCtx->bufferSize = pkt_length + 1024;
    }

    if (JpegCtx->copy_flag)
        jpegd_split_frame(base, pkt_length, JpegCtx->recv_buffer,
                          JpegCtx->bufferSize, &copy_length);

    pos += pkt_length;
    mpp_packet_set_pos(pkt, pos);
    if (copy_length != pkt_length) {
        jpegd_dbg_parser("packet prepare, pkt_length:%d, copy_length:%d\n",
                         pkt_length, copy_length);
    }

    /* debug information */
    if (jpegd_debug & JPEGD_DBG_IO) {
        static FILE *jpg_file;
        static char name[32];

        snprintf(name, sizeof(name) - 1, "/data/input%02d.jpg",
                 JpegCtx->input_jpeg_count);
        jpg_file = fopen(name, "wb+");
        if (jpg_file) {
            jpegd_dbg_io("frame_%02d input jpeg(%d Bytes) saving to %s\n",
                         JpegCtx->input_jpeg_count, pkt_length, name);
            fwrite(base, pkt_length, 1, jpg_file);
            fclose(jpg_file);
            JpegCtx->input_jpeg_count++;
        }
    }

    if (JpegCtx->copy_flag) {
        mpp_packet_set_data(input_packet, JpegCtx->recv_buffer);
        mpp_packet_set_size(input_packet, pkt_length);
        mpp_packet_set_length(input_packet, pkt_length);
        memcpy(base, JpegCtx->recv_buffer, pkt_length);
    }

    JpegCtx->streamLength = pkt_length;
    task->input_packet = input_packet;
    task->valid = 1;
    jpegd_dbg_parser("input_packet:%p, recv_buffer:%p, pkt_length:%d",
                     input_packet,
                     JpegCtx->recv_buffer, pkt_length);

    jpegd_dbg_func("exit\n");
    return ret;
}